

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

FuncDef * sqlite3VtabOverloadFunction(sqlite3 *db,FuncDef *pDef,int nArg,Expr *pExpr)

{
  void *__dest;
  char *__src;
  FuncDef *db_00;
  int iVar1;
  VTable *pVVar2;
  byte *p;
  byte *local_78;
  uchar *z;
  char *zLowerName;
  int rc;
  FuncDef *pNew;
  void *pArg;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFunc;
  sqlite3_module *pMod;
  sqlite3_vtab *pVtab;
  Table *pTab;
  Expr *pExpr_local;
  sqlite3 *psStack_20;
  int nArg_local;
  FuncDef *pDef_local;
  sqlite3 *db_local;
  
  pArg = (void *)0x0;
  pNew = (FuncDef *)0x0;
  zLowerName._4_4_ = 0;
  db_local = (sqlite3 *)pDef;
  if ((((pExpr != (Expr *)0x0) && (pExpr->op == 0x98)) &&
      (pVtab = (sqlite3_vtab *)pExpr->pTab, (Table *)pVtab != (Table *)0x0)) &&
     ((((Table *)pVtab)->tabFlags & 0x10) != 0)) {
    pTab = (Table *)pExpr;
    pExpr_local._4_4_ = nArg;
    psStack_20 = (sqlite3 *)pDef;
    pDef_local = (FuncDef *)db;
    pVVar2 = sqlite3GetVTable(db,(Table *)pVtab);
    pMod = (sqlite3_module *)pVVar2->pVtab;
    xFunc = *(_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **)pMod;
    if (*(long *)(xFunc + 0x90) == 0) {
      db_local = psStack_20;
    }
    else {
      p = (byte *)sqlite3DbStrDup((sqlite3 *)pDef_local,(char *)psStack_20->lastRowid);
      local_78 = p;
      if (p != (byte *)0x0) {
        for (; *local_78 != 0; local_78 = local_78 + 1) {
          *local_78 = ""[*local_78];
        }
        zLowerName._4_4_ = (**(code **)(xFunc + 0x90))(pMod,pExpr_local._4_4_,p,&pArg,&pNew);
        sqlite3DbFree((sqlite3 *)pDef_local,p);
      }
      db_00 = pDef_local;
      if (zLowerName._4_4_ == 0) {
        db_local = psStack_20;
      }
      else {
        iVar1 = sqlite3Strlen30((char *)psStack_20->lastRowid);
        db_local = (sqlite3 *)sqlite3DbMallocZero((sqlite3 *)db_00,iVar1 + 0x49);
        if (db_local == (sqlite3 *)0x0) {
          db_local = psStack_20;
        }
        else {
          memcpy(db_local,psStack_20,0x48);
          db_local->lastRowid = (i64)&db_local->errMask;
          __dest = (void *)db_local->lastRowid;
          __src = (char *)psStack_20->lastRowid;
          iVar1 = sqlite3Strlen30((char *)psStack_20->lastRowid);
          memcpy(__dest,__src,(long)(iVar1 + 1));
          db_local->mutex = (sqlite3_mutex *)pArg;
          db_local->pVdbe = (Vdbe *)pNew;
          *(byte *)((long)&db_local->pVfs + 3) = *(byte *)((long)&db_local->pVfs + 3) | 4;
        }
      }
    }
  }
  return (FuncDef *)db_local;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3VtabOverloadFunction(
  sqlite3 *db,    /* Database connection for reporting malloc problems */
  FuncDef *pDef,  /* Function to possibly overload */
  int nArg,       /* Number of arguments to the function */
  Expr *pExpr     /* First argument to the function */
){
  Table *pTab;
  sqlite3_vtab *pVtab;
  sqlite3_module *pMod;
  void (*xFunc)(sqlite3_context*,int,sqlite3_value**) = 0;
  void *pArg = 0;
  FuncDef *pNew;
  int rc = 0;
  char *zLowerName;
  unsigned char *z;


  /* Check to see the left operand is a column in a virtual table */
  if( NEVER(pExpr==0) ) return pDef;
  if( pExpr->op!=TK_COLUMN ) return pDef;
  pTab = pExpr->pTab;
  if( NEVER(pTab==0) ) return pDef;
  if( (pTab->tabFlags & TF_Virtual)==0 ) return pDef;
  pVtab = sqlite3GetVTable(db, pTab)->pVtab;
  assert( pVtab!=0 );
  assert( pVtab->pModule!=0 );
  pMod = (sqlite3_module *)pVtab->pModule;
  if( pMod->xFindFunction==0 ) return pDef;
 
  /* Call the xFindFunction method on the virtual table implementation
  ** to see if the implementation wants to overload this function 
  */
  zLowerName = sqlite3DbStrDup(db, pDef->zName);
  if( zLowerName ){
    for(z=(unsigned char*)zLowerName; *z; z++){
      *z = sqlite3UpperToLower[*z];
    }
    rc = pMod->xFindFunction(pVtab, nArg, zLowerName, &xFunc, &pArg);
    sqlite3DbFree(db, zLowerName);
  }
  if( rc==0 ){
    return pDef;
  }

  /* Create a new ephemeral function definition for the overloaded
  ** function */
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew)
                             + sqlite3Strlen30(pDef->zName) + 1);
  if( pNew==0 ){
    return pDef;
  }
  *pNew = *pDef;
  pNew->zName = (char *)&pNew[1];
  memcpy(pNew->zName, pDef->zName, sqlite3Strlen30(pDef->zName)+1);
  pNew->xFunc = xFunc;
  pNew->pUserData = pArg;
  pNew->flags |= SQLITE_FUNC_EPHEM;
  return pNew;
}